

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

Gia_Man_t * Gia_ManStuckAtUnfold(Gia_Man_t *p,Vec_Int_t *vMap)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  Gia_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  Vec_Int_t *pVVar9;
  Gia_Man_t *pGVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  char *__assertion;
  Gia_Obj_t *pObj;
  long lVar14;
  long lVar15;
  
  p_00 = Gia_ManStart(p->nObjs * 3);
  pcVar12 = p->pName;
  if (pcVar12 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar12);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar12);
  }
  p_00->pName = pcVar5;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar14 = 0;
    do {
      iVar3 = pVVar9->pArray[lVar14];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0058c16a;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar6 = Gia_ManAppendObj(p_00);
      uVar8 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar8 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar8 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar7 = p_00->pObjs;
      if ((pGVar6 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar6)) goto LAB_0058c14b;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar7) >> 2) * -0x55555555);
      pGVar7 = p_00->pObjs;
      if ((pGVar6 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar6)) goto LAB_0058c14b;
      pGVar2[iVar3].Value = (int)((ulong)((long)pGVar6 - (long)pGVar7) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      pVVar9 = p->vCis;
    } while (lVar14 < pVVar9->nSize);
  }
  if (p->nObjs < 1) {
    uVar11 = 0;
  }
  else {
    lVar14 = 0;
    lVar15 = 8;
    uVar11 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar8 = *(ulong *)((long)pGVar2 + lVar15 + -8);
      if ((uVar8 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar8) {
        uVar13 = *(uint *)((long)pGVar2 +
                          lVar15 + (ulong)(uint)((int)(uVar8 & 0x1fffffff) << 2) * -3);
        if (((int)uVar13 < 0) ||
           (uVar1 = *(uint *)((long)pGVar2 +
                             lVar15 + (ulong)((uint)(uVar8 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar1 < 0)) goto LAB_0058c189;
        iVar3 = Gia_ManHashAnd(p_00,uVar13 ^ (uint)(uVar8 >> 0x1d) & 1,
                               uVar1 ^ (uint)(uVar8 >> 0x3d) & 1);
        *(int *)(&pGVar2->field_0x0 + lVar15) = iVar3;
        if (((int)uVar11 < 0) || (vMap->nSize <= (int)uVar11)) {
LAB_0058c1a8:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar3 = vMap->pArray[uVar11];
        pGVar7 = Gia_ManAppendObj(p_00);
        uVar8 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 = uVar8 | 0x9fffffff;
        uVar8 = uVar8 & 0xe0000000ffffffff | 0x9fffffff;
        if (iVar3 == 0) {
          *(ulong *)pGVar7 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar8;
          pGVar6 = p_00->pObjs;
          if ((pGVar7 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar7)) goto LAB_0058c14b;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar6) >> 2) * -0x55555555);
          if ((pGVar7 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar7)) goto LAB_0058c14b;
        }
        else {
          *(ulong *)pGVar7 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar8;
          pGVar6 = p_00->pObjs;
          if ((pGVar7 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar7)) goto LAB_0058c14b;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar6) >> 2) * -0x55555555);
          pGVar6 = p_00->pObjs;
          if ((pGVar7 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar7)) goto LAB_0058c14b;
          uVar13 = (int)((ulong)((long)pGVar7 - (long)pGVar6) >> 2) * 0x55555556;
          if ((int)uVar13 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          iVar3 = Gia_ManHashAnd(p_00,uVar13 | 1,*(int *)(&pGVar2->field_0x0 + lVar15));
          *(int *)(&pGVar2->field_0x0 + lVar15) = iVar3;
        }
        uVar13 = uVar11 + 1;
        if (vMap->nSize <= (int)uVar13) goto LAB_0058c1a8;
        uVar11 = uVar11 + 2;
        iVar3 = vMap->pArray[uVar13];
        pGVar7 = Gia_ManAppendObj(p_00);
        uVar8 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 = uVar8 | 0x9fffffff;
        uVar8 = uVar8 & 0xe0000000ffffffff | 0x9fffffff;
        if (iVar3 == 0) {
          *(ulong *)pGVar7 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar8;
          pGVar2 = p_00->pObjs;
          if ((pGVar7 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar7)) goto LAB_0058c14b;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
          if ((pGVar7 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar7)) goto LAB_0058c14b;
        }
        else {
          *(ulong *)pGVar7 = (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20 | uVar8;
          pGVar6 = p_00->pObjs;
          if ((pGVar7 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar7)) goto LAB_0058c14b;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar6) >> 2) * -0x55555555);
          pGVar6 = p_00->pObjs;
          if ((pGVar7 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar7)) goto LAB_0058c14b;
          iVar3 = Gia_ManHashOr(p_00,(int)((ulong)((long)pGVar7 - (long)pGVar6) >> 2) * 0x55555556,
                                *(int *)(&pGVar2->field_0x0 + lVar15));
          *(int *)(&pGVar2->field_0x0 + lVar15) = iVar3;
        }
      }
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar14 < p->nObjs);
  }
  if (uVar11 == vMap->nSize) {
    pVVar9 = p->vCos;
    if (0 < pVVar9->nSize) {
      lVar14 = 0;
      do {
        iVar3 = pVVar9->pArray[lVar14];
        if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_0058c16a:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar2 = p->pObjs + iVar3;
        if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0) {
LAB_0058c189:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar11 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                      pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].
                                      Value);
        pGVar2->Value = uVar11;
        lVar14 = lVar14 + 1;
        pVVar9 = p->vCos;
      } while (lVar14 < pVVar9->nSize);
    }
    pGVar10 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
    iVar3 = p->vCis->nSize;
    if (pGVar10->vCis->nSize - pGVar10->nRegs != iVar3 + (~(p->vCos->nSize + iVar3) + p->nObjs) * 2)
    {
      __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + 2 * Gia_ManAndNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                    ,0x1de,"Gia_Man_t *Gia_ManStuckAtUnfold(Gia_Man_t *, Vec_Int_t *)");
    }
    return pGVar10;
  }
  __assertion = "iFuncVars == Vec_IntSize(vMap)";
  pcVar5 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c";
  pcVar12 = "Gia_Man_t *Gia_ManStuckAtUnfold(Gia_Man_t *, Vec_Int_t *)";
LAB_0058c160:
  __assert_fail(__assertion,pcVar5,0x1d9,pcVar12);
LAB_0058c14b:
  __assertion = "p->pObjs <= pObj && pObj < p->pObjs + p->nObjs";
  pcVar5 = "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h";
  pcVar12 = "int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)";
  goto LAB_0058c160;
}

Assistant:

Gia_Man_t * Gia_ManStuckAtUnfold( Gia_Man_t * p, Vec_Int_t * vMap )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iFuncVars = 0;
    pNew = Gia_ManStart( 3 * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );

        if ( Vec_IntEntry(vMap, iFuncVars++) )
            pObj->Value = Gia_ManHashAnd( pNew, Abc_LitNot(Gia_ManAppendCi(pNew)), pObj->Value );
        else
            Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) )
            pObj->Value = Gia_ManHashOr( pNew, Gia_ManAppendCi(pNew), pObj->Value );
        else
            Gia_ManAppendCi(pNew);
    }
    assert( iFuncVars == Vec_IntSize(vMap) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + 2 * Gia_ManAndNum(p) );
    return pNew;
}